

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O1

void __thiscall DColorPickerMenu::Destroy(DColorPickerMenu *this)

{
  FOptionMenuItem *pFVar1;
  uint i;
  int iVar2;
  UCVarValue value;
  
  if (-1 < this->mStartItem) {
    iVar2 = 0;
    do {
      pFVar1 = (((this->super_DOptionMenu).mDesc)->mItems).
               super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
               [(uint)(this->mStartItem + iVar2)];
      if (pFVar1 != (FOptionMenuItem *)0x0) {
        (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Resize
                (&(((this->super_DOptionMenu).mDesc)->mItems).
                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,this->mStartItem);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 8);
    if (this->mCVar != (FColorCVar *)0x0) {
      value._0_4_ = (int)this->mBlue | (int)this->mGreen << 8 | (int)this->mRed << 0x10;
      value._4_4_ = 0;
      FBaseCVar::SetGenericRep((FBaseCVar *)this->mCVar,value,CVAR_Int);
    }
    this->mStartItem = -1;
  }
  return;
}

Assistant:

void Destroy() override
	{
		if (mStartItem >= 0)
		{
			for(unsigned i=0;i<8;i++)
			{
				delete mDesc->mItems[mStartItem+i];
				mDesc->mItems.Resize(mStartItem);
			}
			UCVarValue val;
			val.Int = MAKERGB(int(mRed), int(mGreen), int(mBlue));
			if (mCVar != NULL) mCVar->SetGenericRep (val, CVAR_Int);
			mStartItem = -1;
		}
	}